

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::PrepareProgram
          (BufferTest *this,GLchar *variable_declaration)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  GLint GVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  char *pcVar9;
  undefined4 *puVar10;
  bool *pbVar11;
  bool *pbVar12;
  long lVar13;
  GLint status_1;
  GLint log_size;
  MessageBuilder *local_220;
  char *local_218;
  long local_210 [2];
  undefined8 local_200;
  undefined4 local_1f8 [2];
  undefined *local_1f0;
  GLchar *local_1e8;
  undefined *local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  GLint status;
  uint uStack_1bc;
  int local_1b8;
  undefined1 local_1b0 [384];
  long lVar8;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  local_218 = s_vertex_shader;
  local_210[0] = 0;
  local_210[1] = 0;
  local_200 = 0x8b3100000001;
  local_1f8[0] = 0;
  local_1f0 = s_fragment_shader_head;
  local_1e0 = s_fragment_shader_tail;
  local_1d8 = 0x8b3000000003;
  local_1d0 = 0;
  local_1e8 = variable_declaration;
  GVar5 = (**(code **)(lVar8 + 0x3c8))();
  this->m_po = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x3d3);
  for (lVar13 = 0; lVar13 != 0x50; lVar13 = lVar13 + 0x28) {
    uVar7 = (**(code **)(lVar8 + 0x3f0))(*(undefined4 *)((long)local_1f8 + lVar13 + -4));
    *(undefined4 *)((long)local_1f8 + lVar13) = uVar7;
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCreateShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3dc);
    (**(code **)(lVar8 + 0x10))(this->m_po,*(undefined4 *)((long)local_1f8 + lVar13));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glAttachShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3e0);
    (**(code **)(lVar8 + 0x12b8))
              (*(undefined4 *)((long)local_1f8 + lVar13),
               *(undefined4 *)((long)local_1f8 + lVar13 + -8),(char **)((long)&local_218 + lVar13),0
              );
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glShaderSource call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3e4);
    (**(code **)(lVar8 + 0x248))(*(undefined4 *)((long)local_1f8 + lVar13));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCompileShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,1000);
    status_1 = 0;
    (**(code **)(lVar8 + 0xa70))(*(undefined4 *)((long)local_1f8 + lVar13),0x8b81,&status_1);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetShaderiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3ed);
    if (status_1 == 0) {
      log_size = 0;
      (**(code **)(lVar8 + 0xa70))(*(undefined4 *)((long)local_1f8 + lVar13),0x8b84);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x3f3);
      GVar3 = log_size;
      pcVar9 = (char *)operator_new__((long)log_size);
      (**(code **)(lVar8 + 0xa58))(*(undefined4 *)((long)local_1f8 + lVar13),GVar3,0,pcVar9);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Shader compilation has failed.\n");
      std::operator<<((ostream *)poVar2,"Shader type: ");
      local_1b8 = *(int *)((long)local_1f8 + lVar13 + -4);
      _status = glu::getShaderTypeName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&status,(ostream *)poVar2);
      std::operator<<((ostream *)poVar2,"\n");
      std::operator<<((ostream *)poVar2,"Shader compilation error log:\n");
      std::operator<<((ostream *)poVar2,pcVar9);
      std::operator<<((ostream *)poVar2,"\n");
      std::operator<<((ostream *)poVar2,"Shader source code:\n");
      local_220 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,(char **)((long)&local_218 + lVar13));
      pbVar12 = *(bool **)((long)local_210 + lVar13);
      if (pbVar12 == (bool *)0x0) {
        pbVar12 = glcts::fixed_sample_locations_values + 1;
      }
      poVar1 = &local_220->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pbVar12);
      pbVar12 = *(bool **)((long)local_210 + lVar13 + 8);
      pbVar11 = glcts::fixed_sample_locations_values + 1;
      if (pbVar12 != (bool *)0x0) {
        pbVar11 = pbVar12;
      }
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pbVar11);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      tcu::MessageBuilder::operator<<(local_220,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      operator_delete__(pcVar9);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x405);
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
  }
  (**(code **)(lVar8 + 0xce8))(this->m_po);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x40f);
  _status = (code *)((ulong)uStack_1bc << 0x20);
  (**(code **)(lVar8 + 0x9d8))(this->m_po,0x8b82);
  if (status != 1) {
    status_1 = 0;
    (**(code **)(lVar8 + 0x9d8))(this->m_po,0x8b84);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetProgramiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x427);
    GVar3 = status_1;
    pcVar9 = (char *)operator_new__((long)status_1);
    (**(code **)(lVar8 + 0x988))(this->m_po,GVar3,0,pcVar9);
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Program linkage has failed due to:\n");
    std::operator<<((ostream *)poVar2,pcVar9);
    std::operator<<((ostream *)poVar2,"\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    operator_delete__(pcVar9);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetProgramInfoLog call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x433);
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  for (lVar13 = 0x20; lVar13 != 0x70; lVar13 = lVar13 + 0x28) {
    if (*(int *)((long)&local_218 + lVar13) != 0) {
      (**(code **)(lVar8 + 0x4e0))(this->m_po);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glDetachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x41d);
    }
  }
  for (lVar13 = 0x20; lVar13 != 0x70; lVar13 = lVar13 + 0x28) {
    if (*(int *)((long)&local_218 + lVar13) != 0) {
      (**(code **)(lVar8 + 0x470))();
      *(undefined4 *)((long)&local_218 + lVar13) = 0;
    }
  }
  if (this->m_po != 0) {
    return;
  }
  puVar10 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar10 = 0;
  __cxa_throw(puVar10,&int::typeinfo,0);
}

Assistant:

void BufferTest::PrepareProgram(const glw::GLchar* variable_declaration)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* source[3];
		glw::GLsizei const count;
		glw::GLenum const  type;
		glw::GLuint		   id;
	} shader[] = {
		{ { s_vertex_shader, NULL, NULL }, 1, GL_VERTEX_SHADER, 0 },
		{ { s_fragment_shader_head, variable_declaration, s_fragment_shader_tail }, 3, GL_FRAGMENT_SHADER, 0 }
	};

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		m_po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(m_po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, shader[i].count, shader[i].source, NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source[0] << (shader[i].source[1] ? shader[i].source[1] : "")
						<< (shader[i].source[2] ? shader[i].source[2] : "") << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(m_po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(m_po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(m_po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(m_po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(m_po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (m_po)
		{
			gl.deleteProgram(m_po);

			m_po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == m_po)
	{
		throw 0;
	}
}